

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeVector.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMNodeVector::checkSpace(DOMNodeVector *this)

{
  int iVar1;
  undefined4 extraout_var;
  DOMNode **ppDVar2;
  XMLSize_t XVar3;
  long *local_50;
  ulong local_38;
  XMLSize_t i;
  DOMNode **newData;
  DOMDocument *doc;
  XMLSize_t newAllocatedSize;
  XMLSize_t grow;
  DOMNodeVector *this_local;
  
  if (this->nextFreeSlot == this->allocatedSize) {
    newAllocatedSize = this->allocatedSize >> 1;
    if (newAllocatedSize < 10) {
      newAllocatedSize = 10;
    }
    XVar3 = this->allocatedSize + newAllocatedSize;
    iVar1 = (*(*this->data)->_vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var,iVar1) == 0) {
      local_50 = (long *)0x0;
    }
    else {
      local_50 = (long *)(CONCAT44(extraout_var,iVar1) + -8);
    }
    ppDVar2 = (DOMNode **)(**(code **)(*local_50 + 0x20))(local_50,XVar3 * 8);
    if (ppDVar2 == (DOMNode **)0x0) {
      __assert_fail("newData != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeVector.cpp"
                    ,0x50,"void xercesc_4_0::DOMNodeVector::checkSpace()");
    }
    for (local_38 = 0; local_38 < this->allocatedSize; local_38 = local_38 + 1) {
      ppDVar2[local_38] = this->data[local_38];
    }
    this->allocatedSize = XVar3;
    this->data = ppDVar2;
  }
  return;
}

Assistant:

void DOMNodeVector::checkSpace() {
    if (nextFreeSlot == allocatedSize) {
        XMLSize_t grow = allocatedSize/2;
        if (grow < 10) grow = 10;
        const XMLSize_t newAllocatedSize = allocatedSize + grow;
        DOMDocument *doc = data[0]->getOwnerDocument();

        //DOMNode **newData = new (doc) DOMNode *[newAllocatedSize];
        DOMNode **newData = (DOMNode**) ((DOMDocumentImpl *)doc)->allocate(sizeof(DOMNode*) * newAllocatedSize);

        assert(newData != 0);
        for (XMLSize_t i=0; i<allocatedSize; i++) {
            newData[i] = data[i];
        }
        // delete [] data;  // revisit.  Can't delete!  Recycle?
        allocatedSize = newAllocatedSize;
        data = newData;
    }
}